

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_91bd::verifyPixelsAreEqual<half>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ImageLevel *this;
  Box2i *pBVar7;
  half *phVar8;
  ArgExc *this_00;
  undefined8 in_RSI;
  ImageChannel *in_RDI;
  float fVar9;
  float fVar10;
  int x;
  int y;
  int yStep;
  int xStep;
  Box2i *dataWindow;
  TypedFlatImageChannel<half> *tc2;
  TypedFlatImageChannel<half> *tc1;
  
  lVar5 = __dynamic_cast(in_RDI,&Imf_2_5::FlatImageChannel::typeinfo,
                         &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0);
  if (lVar5 == 0) {
    __cxa_bad_cast();
  }
  lVar6 = __dynamic_cast(in_RSI,&Imf_2_5::FlatImageChannel::typeinfo,
                         &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0);
  if (lVar6 == 0) {
    __cxa_bad_cast();
  }
  this = Imf_2_5::ImageChannel::level(in_RDI);
  pBVar7 = Imf_2_5::ImageLevel::dataWindow(this);
  iVar1 = Imf_2_5::ImageChannel::xSampling(in_RDI);
  iVar2 = Imf_2_5::ImageChannel::ySampling(in_RDI);
  iVar4 = (pBVar7->min).y;
  do {
    if ((pBVar7->max).y < iVar4) {
      return;
    }
    for (iVar3 = (pBVar7->min).x; iVar3 <= (pBVar7->max).x; iVar3 = iVar1 + iVar3) {
      phVar8 = Imf_2_5::TypedFlatImageChannel<half>::at
                         ((TypedFlatImageChannel<half> *)CONCAT44(iVar4,iVar3),
                          (int)((ulong)lVar5 >> 0x20),(int)lVar5);
      fVar9 = half::operator_cast_to_float(phVar8);
      phVar8 = Imf_2_5::TypedFlatImageChannel<half>::at
                         ((TypedFlatImageChannel<half> *)CONCAT44(iVar4,iVar3),
                          (int)((ulong)lVar5 >> 0x20),(int)lVar5);
      fVar10 = half::operator_cast_to_float(phVar8);
      if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this_00,"different pixel values");
        __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    iVar4 = iVar2 + iVar4;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual
    (const FlatImageChannel &c1,
     const FlatImageChannel &c2,
     int dx,
     int dy)
{
    const TypedFlatImageChannel<T> &tc1 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T> &tc2 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    int xStep = c1.xSampling();
    int yStep = c1.ySampling();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}